

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

Abc_SccCost_t Abc_TgRecordPhase(Abc_TgMan_t *pMan,int mode)

{
  Vec_Int_t *p;
  Abc_SccCost_t AVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint Entry;
  int local_fc;
  int local_e8 [2];
  int pMinScc [18];
  int local_98 [2];
  int pScc [18];
  int nCoefs;
  int nStart;
  int n;
  int j;
  int i;
  Vec_Int_t *vPhase;
  int mode_local;
  Abc_TgMan_t *pMan_local;
  int iStack_10;
  Abc_SccCost_t ret;
  
  p = pMan->vPhase;
  pMan_local._4_4_ = (int)pMan->pGroup[0].nGVars;
  uVar2 = (uint)(mode == 0);
  iVar3 = (pMan->nGVars + 2) - uVar2;
  if (pMan->fPhased == 0) {
    Abc_TgReorderFGrps(pMan);
    local_e8[1] = Abc_TtScc(pMan->pTruth,pMan->nVars);
    Abc_TgCalcScc(pMan,pMinScc,1);
    if (mode == 0) {
      local_fc = 0;
    }
    else {
      local_fc = Abc_TgPermCostScc(pMan,pMinScc);
    }
    local_e8[0] = local_fc;
    Vec_IntPush(p,0);
    n = 0;
    while (iVar4 = grayFlip(n), iVar4 < pMan_local._4_4_) {
      Abc_TgFlipSymGroupByVar(pMan,(int)pMan->pFGrps[iVar4]);
      local_98[1] = Abc_TtScc(pMan->pTruth,pMan->nVars);
      if ((mode != 0) || (local_98[1] <= local_e8[1])) {
        Abc_TgCalcScc(pMan,pScc,1);
        if (0 < mode) {
          local_98[0] = Abc_TgPermCostScc(pMan,pScc);
        }
        iVar4 = Abc_TgCompareCoef(local_98 + (int)uVar2,local_e8 + (int)uVar2,iVar3);
        if (iVar4 < 0) {
          memcpy(local_e8 + (int)uVar2,local_98 + (int)uVar2,(long)iVar3 << 2);
          Vec_IntClear(p);
        }
        iVar4 = Abc_TgCompareCoef(local_98 + (int)uVar2,local_e8 + (int)uVar2,iVar3);
        if (iVar4 == 0) {
          Entry = grayCode(n + 1);
          Vec_IntPush(p,Entry);
        }
      }
      n = n + 1;
    }
    Abc_TgFlipSymGroupByVar(pMan,(int)pMan->pFGrps[pMan_local._4_4_ + -1]);
    iVar3 = Vec_IntSize(p);
    iStack_10 = ilog2(iVar3);
    ret.cNeg = Abc_TgPermCostScc(pMan,pMinScc);
  }
  else {
    pMan_local._4_4_ = 0;
    iStack_10 = 0;
    Abc_TgCalcScc(pMan,pScc,1);
    ret.cNeg = Abc_TgPermCostScc(pMan,pScc);
  }
  AVar1.cPhase = iStack_10;
  AVar1.cNeg = pMan_local._4_4_;
  AVar1.cPerm = ret.cNeg;
  return AVar1;
}

Assistant:

static Abc_SccCost_t Abc_TgRecordPhase(Abc_TgMan_t * pMan, int mode)
{
    Vec_Int_t * vPhase = pMan->vPhase;
    int i, j, n = pMan->pGroup->nGVars;
    int nStart = mode == 0 ? 1 : 0;
    int nCoefs = pMan->nGVars + 2 - nStart;
    int pScc[18], pMinScc[18];
    Abc_SccCost_t ret;

    if (pMan->fPhased)
    {
        ret.cNeg = 0;
        ret.cPhase = 0;
        Abc_TgCalcScc(pMan, pScc + 2, 1);
        ret.cPerm = Abc_TgPermCostScc(pMan, pScc + 2);
        return ret;
    }

    Abc_TgReorderFGrps(pMan);
    pMinScc[1] = Abc_TtScc(pMan->pTruth, pMan->nVars);
    Abc_TgCalcScc(pMan, pMinScc + 2, 1);
    pMinScc[0] = mode == 0 ? 0 : Abc_TgPermCostScc(pMan, pMinScc + 2);
    Vec_IntPush(vPhase, 0);
    for (i = 0; (j = grayFlip(i)) < n; i++)
    {
        Abc_TgFlipSymGroupByVar(pMan, pMan->pFGrps[j]);
        pScc[1] = Abc_TtScc(pMan->pTruth, pMan->nVars);
        if (mode == 0 && pScc[1] > pMinScc[1]) continue;
        Abc_TgCalcScc(pMan, pScc + 2, 1);
        if (mode > 0)
            pScc[0] = Abc_TgPermCostScc(pMan, pScc + 2);
        if (Abc_TgCompareCoef(pScc + nStart, pMinScc + nStart, nCoefs) < 0)
        {
            memcpy(pMinScc + nStart, pScc + nStart, nCoefs * sizeof(int));
            Vec_IntClear(vPhase);
        }
        if (Abc_TgCompareCoef(pScc + nStart, pMinScc + nStart, nCoefs) == 0)
            Vec_IntPush(vPhase, grayCode(i+1));
    }
    Abc_TgFlipSymGroupByVar(pMan, pMan->pFGrps[n - 1]);

    ret.cNeg = n;
    ret.cPhase = ilog2(Vec_IntSize(vPhase));
    ret.cPerm = Abc_TgPermCostScc(pMan, pMinScc + 2);
    return ret;
}